

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O1

int init(EVP_PKEY_CTX *ctx)

{
  char cVar1;
  bool bVar2;
  time_t tVar3;
  undefined8 unaff_RBX;
  char *fmt;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    fmt = "Error initialising Allegro.\n";
  }
  else {
    al_set_org_name("Allegro");
    al_set_app_name("Cosmic Protector");
    al_init_image_addon();
    al_init_font_addon();
    al_init_acodec_addon();
    al_init_primitives_addon();
    bVar2 = loadResources();
    if (bVar2) {
      return (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
    }
    fmt = "Error loading resources.\n";
  }
  debug_message(fmt);
  return 0;
}

Assistant:

bool init(void)
{
   srand(time(NULL));
   if (!al_init()) {
      debug_message("Error initialising Allegro.\n");
      return false;
   }
   al_set_org_name("Allegro");
   al_set_app_name("Cosmic Protector");
   al_init_image_addon();
   al_init_font_addon();
   al_init_acodec_addon();
   al_init_primitives_addon();
#ifdef ALLEGRO_ANDROID
   al_android_set_apk_file_interface();
#endif

   if (!loadResources()) {
      debug_message("Error loading resources.\n");
      return false;
   }

   return true;
}